

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

void MatchFinder_Init_4(CMatchFinder *p)

{
  if (p->directInput == '\0') {
    p->buffer = p->bufBase;
  }
  p->streamPos = 1;
  p->pos = 1;
  p->result = 0;
  p->streamEndWasReached = '\0';
  return;
}

Assistant:

void MatchFinder_Init_4(CMatchFinder *p)
{
  if (!p->directInput)
    p->buffer = p->bufBase;
  {
    /* kEmptyHashValue = 0 (Zero) is used in hash tables as NO-VALUE marker.
       the code in CMatchFinderMt expects (pos = 1) */
    p->pos =
    p->streamPos =
        1; // it's smallest optimal value. do not change it
        // 0; // for debug
  }
  p->result = SZ_OK;
  p->streamEndWasReached = 0;
}